

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HUF_decompress1X2_usingDTable_internal_bmi2
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable)

{
  uint uVar1;
  DTableDesc DVar2;
  BIT_DStream_t *code;
  undefined2 *puVar3;
  HUF_DTable *pHVar4;
  size_t sVar5;
  size_t in_RCX;
  void *in_RDX;
  ulong uVar6;
  BIT_DStream_t *in_RSI;
  undefined2 *in_RDI;
  HUF_DTable *in_R8;
  bool bVar7;
  DTableDesc dtd;
  HUF_DEltX2 *dt;
  void *dtPtr;
  BYTE *oend;
  BYTE *ostart;
  size_t _var_err__;
  BIT_DStream_t bitD;
  BYTE *pStart;
  BIT_DStream_status result_3;
  U32 nbBytes_3;
  BIT_DStream_status result_2;
  U32 nbBytes_2;
  BIT_DStream_status result_1;
  U32 nbBytes_1;
  BIT_DStream_status result;
  U32 nbBytes;
  size_t val_4;
  size_t val_3;
  size_t val_2;
  size_t val_1;
  size_t val;
  size_t val_5;
  size_t val_7;
  size_t val_8;
  size_t val_6;
  size_t val_9;
  size_t val_10;
  size_t val_11;
  BIT_DStream_t *in_stack_fffffffffffffc08;
  BIT_DStream_t local_398;
  HUF_DTable *local_370;
  BIT_DStream_t *local_358;
  undefined2 *local_350;
  BIT_DStream_t *local_348;
  undefined2 *local_340;
  uint local_334;
  HUF_DTable *local_330;
  undefined2 *local_328;
  BIT_DStream_t *local_320;
  undefined2 *local_318;
  BIT_DStream_status local_310;
  uint local_30c;
  BIT_DStream_t *local_308;
  BIT_DStream_status local_2fc;
  BIT_DStream_status local_2f8;
  uint local_2f4;
  BIT_DStream_t *local_2f0;
  BIT_DStream_status local_2e4;
  BIT_DStream_status local_2e0;
  uint local_2dc;
  BIT_DStream_t *local_2d8;
  BIT_DStream_status local_2cc;
  BIT_DStream_status local_2c8;
  uint local_2c4;
  BIT_DStream_t *local_2c0;
  BIT_DStream_status local_2b4;
  size_t local_2b0;
  U32 local_2a4;
  HUF_DTable *local_2a0;
  BIT_DStream_t *local_298;
  undefined2 *local_290;
  uint local_284;
  BIT_DStream_t *local_280;
  size_t local_278;
  U32 local_26c;
  HUF_DTable *local_268;
  BIT_DStream_t *local_260;
  undefined2 *local_258;
  uint local_24c;
  BIT_DStream_t *local_248;
  size_t local_240;
  U32 local_234;
  HUF_DTable *local_230;
  BIT_DStream_t *local_228;
  undefined2 *local_220;
  uint local_214;
  BIT_DStream_t *local_210;
  size_t local_208;
  U32 local_1fc;
  HUF_DTable *local_1f8;
  BIT_DStream_t *local_1f0;
  undefined2 *local_1e8;
  uint local_1dc;
  BIT_DStream_t *local_1d8;
  size_t local_1d0;
  U32 local_1c4;
  HUF_DTable *local_1c0;
  BIT_DStream_t *local_1b8;
  undefined2 *local_1b0;
  uint local_1a4;
  BIT_DStream_t *local_1a0;
  size_t local_198;
  U32 local_18c;
  HUF_DTable *local_188;
  BIT_DStream_t *local_180;
  undefined2 *local_178;
  uint local_16c;
  BIT_DStream_t *local_168;
  size_t local_160;
  U32 local_154;
  HUF_DTable *local_150;
  BIT_DStream_t *local_148;
  undefined2 *local_140;
  uint local_134;
  BIT_DStream_t *local_130;
  size_t local_128;
  U32 local_11c;
  HUF_DTable *local_118;
  BIT_DStream_t *local_110;
  undefined2 *local_108;
  uint local_fc;
  BIT_DStream_t *local_f8;
  size_t local_f0;
  U32 local_e4;
  HUF_DTable *local_e0;
  BIT_DStream_t *local_d8;
  undefined2 *local_d0;
  uint local_c4;
  BIT_DStream_t *local_c0;
  size_t local_b8;
  U32 local_ac;
  HUF_DTable *local_a8;
  BIT_DStream_t *local_a0;
  undefined2 *local_98;
  uint local_8c;
  BIT_DStream_t *local_88;
  size_t local_80;
  U32 local_74;
  HUF_DTable *local_70;
  BIT_DStream_t *local_68;
  undefined2 *local_60;
  uint local_54;
  BIT_DStream_t *local_50;
  size_t local_48;
  U32 local_3c;
  HUF_DTable *local_38;
  BIT_DStream_t *local_30;
  undefined2 *local_28;
  uint local_1c;
  BIT_DStream_t *local_18;
  uint local_c;
  BIT_DStream_t *local_8;
  
  local_370 = in_R8;
  local_358 = in_RSI;
  local_350 = in_RDI;
  code = (BIT_DStream_t *)BIT_initDStream(in_RSI,in_RDX,in_RCX);
  uVar1 = ERR_isError((size_t)code);
  local_348 = code;
  if (uVar1 == 0) {
    puVar3 = (undefined2 *)((long)local_350 + (long)local_358);
    pHVar4 = local_370 + 1;
    DVar2 = HUF_getDTableDesc(local_370);
    local_318 = local_350;
    local_320 = &local_398;
    local_334 = (uint)DVar2 >> 0x10 & 0xff;
    local_340 = local_350;
    local_330 = pHVar4;
    local_328 = puVar3;
    if ((ulong)((long)puVar3 - (long)local_350) < 8) {
      local_2f0 = local_320;
      if (local_398.bitsConsumed < 0x41) {
        if (local_398.ptr < local_398.limitPtr) {
          if (local_398.ptr == local_398.start) {
            if (local_398.bitsConsumed < 0x40) {
              local_2e4 = BIT_DStream_endOfBuffer;
            }
            else {
              local_2e4 = BIT_DStream_completed;
            }
          }
          else {
            local_2f4 = local_398.bitsConsumed >> 3;
            uVar6 = (ulong)local_2f4;
            if (local_398.ptr + -uVar6 < local_398.start) {
              local_2f4 = (int)local_398.ptr - (int)local_398.start;
            }
            local_2f8 = (BIT_DStream_status)(local_398.ptr + -uVar6 < local_398.start);
            local_398.ptr = local_398.ptr + -(ulong)local_2f4;
            sVar5 = MEM_readLEST(in_stack_fffffffffffffc08);
            local_2f0->bitContainer = sVar5;
            local_2e4 = local_2f8;
          }
        }
        else {
          local_2e4 = BIT_reloadDStreamFast(in_stack_fffffffffffffc08);
        }
      }
      else {
        local_2e4 = BIT_DStream_overflow;
      }
    }
    else if ((local_334 < 0xc) && (uVar1 = MEM_64bits(), uVar1 != 0)) {
      while( true ) {
        local_2c0 = local_320;
        if (local_320->bitsConsumed < 0x41) {
          if (local_320->ptr < local_320->limitPtr) {
            if (local_320->ptr == local_320->start) {
              if (local_320->bitsConsumed < 0x40) {
                local_2b4 = BIT_DStream_endOfBuffer;
              }
              else {
                local_2b4 = BIT_DStream_completed;
              }
            }
            else {
              local_2c4 = local_320->bitsConsumed >> 3;
              bVar7 = local_320->ptr + -(ulong)local_2c4 < local_320->start;
              if (bVar7) {
                local_2c4 = (int)local_320->ptr - (int)local_320->start;
              }
              local_2c8 = (BIT_DStream_status)bVar7;
              local_320->ptr = local_320->ptr + -(ulong)local_2c4;
              local_2c0->bitsConsumed = local_2c0->bitsConsumed + local_2c4 * -8;
              sVar5 = MEM_readLEST(in_stack_fffffffffffffc08);
              local_2c0->bitContainer = sVar5;
              local_2b4 = local_2c8;
            }
          }
          else {
            local_2b4 = BIT_reloadDStreamFast(in_stack_fffffffffffffc08);
          }
        }
        else {
          local_2b4 = BIT_DStream_overflow;
        }
        if (local_2b4 != BIT_DStream_unfinished || (undefined2 *)((long)local_328 + -9) <= local_318
           ) break;
        local_1b0 = local_318;
        local_1b8 = local_320;
        local_1c0 = local_330;
        local_1c4 = local_334;
        local_1d0 = BIT_lookBitsFast(local_320,local_334);
        *local_1b0 = (short)local_1c0[local_1d0];
        local_1a0 = local_1b8;
        local_1a4 = (uint)*(byte *)((long)local_1c0 + local_1d0 * 4 + 2);
        local_1b8->bitsConsumed = local_1a4 + local_1b8->bitsConsumed;
        local_318 = (undefined2 *)
                    ((long)local_318 + (ulong)*(byte *)((long)local_1c0 + local_1d0 * 4 + 3));
        local_1f0 = local_320;
        local_1f8 = local_330;
        local_1fc = local_334;
        local_1e8 = local_318;
        local_208 = BIT_lookBitsFast(local_320,local_334);
        *local_1e8 = (short)local_1f8[local_208];
        local_1d8 = local_1f0;
        local_1dc = (uint)*(byte *)((long)local_1f8 + local_208 * 4 + 2);
        local_1f0->bitsConsumed = local_1dc + local_1f0->bitsConsumed;
        local_318 = (undefined2 *)
                    ((long)local_318 + (ulong)*(byte *)((long)local_1f8 + local_208 * 4 + 3));
        local_228 = local_320;
        local_230 = local_330;
        local_234 = local_334;
        local_220 = local_318;
        local_240 = BIT_lookBitsFast(local_320,local_334);
        *local_220 = (short)local_230[local_240];
        local_210 = local_228;
        local_214 = (uint)*(byte *)((long)local_230 + local_240 * 4 + 2);
        local_228->bitsConsumed = local_214 + local_228->bitsConsumed;
        local_318 = (undefined2 *)
                    ((long)local_318 + (ulong)*(byte *)((long)local_230 + local_240 * 4 + 3));
        local_260 = local_320;
        local_268 = local_330;
        local_26c = local_334;
        local_258 = local_318;
        local_278 = BIT_lookBitsFast(local_320,local_334);
        *local_258 = (short)local_268[local_278];
        local_248 = local_260;
        local_24c = (uint)*(byte *)((long)local_268 + local_278 * 4 + 2);
        local_260->bitsConsumed = local_24c + local_260->bitsConsumed;
        local_318 = (undefined2 *)
                    ((long)local_318 + (ulong)*(byte *)((long)local_268 + local_278 * 4 + 3));
        local_298 = local_320;
        local_2a0 = local_330;
        local_2a4 = local_334;
        local_290 = local_318;
        local_2b0 = BIT_lookBitsFast(local_320,local_334);
        *local_290 = (short)local_2a0[local_2b0];
        local_280 = local_298;
        local_284 = (uint)*(byte *)((long)local_2a0 + local_2b0 * 4 + 2);
        local_298->bitsConsumed = local_284 + local_298->bitsConsumed;
        local_318 = (undefined2 *)
                    ((long)local_318 + (ulong)*(byte *)((long)local_2a0 + local_2b0 * 4 + 3));
      }
    }
    else {
      while( true ) {
        local_2d8 = local_320;
        if (local_320->bitsConsumed < 0x41) {
          if (local_320->ptr < local_320->limitPtr) {
            if (local_320->ptr == local_320->start) {
              if (local_320->bitsConsumed < 0x40) {
                local_2cc = BIT_DStream_endOfBuffer;
              }
              else {
                local_2cc = BIT_DStream_completed;
              }
            }
            else {
              local_2dc = local_320->bitsConsumed >> 3;
              bVar7 = local_320->ptr + -(ulong)local_2dc < local_320->start;
              if (bVar7) {
                local_2dc = (int)local_320->ptr - (int)local_320->start;
              }
              local_2e0 = (BIT_DStream_status)bVar7;
              local_320->ptr = local_320->ptr + -(ulong)local_2dc;
              local_2d8->bitsConsumed = local_2d8->bitsConsumed + local_2dc * -8;
              sVar5 = MEM_readLEST(in_stack_fffffffffffffc08);
              local_2d8->bitContainer = sVar5;
              local_2cc = local_2e0;
            }
          }
          else {
            local_2cc = BIT_reloadDStreamFast(in_stack_fffffffffffffc08);
          }
        }
        else {
          local_2cc = BIT_DStream_overflow;
        }
        if (local_2cc != BIT_DStream_unfinished || (undefined2 *)((long)local_328 + -7) <= local_318
           ) break;
        uVar1 = MEM_64bits();
        if (uVar1 != 0) {
          local_178 = local_318;
          local_180 = local_320;
          local_188 = local_330;
          local_18c = local_334;
          local_198 = BIT_lookBitsFast(local_320,local_334);
          *local_178 = (short)local_188[local_198];
          local_168 = local_180;
          local_16c = (uint)*(byte *)((long)local_188 + local_198 * 4 + 2);
          local_180->bitsConsumed = local_16c + local_180->bitsConsumed;
          local_318 = (undefined2 *)
                      ((long)local_318 + (ulong)*(byte *)((long)local_188 + local_198 * 4 + 3));
        }
        MEM_64bits();
        local_d0 = local_318;
        local_d8 = local_320;
        local_e0 = local_330;
        local_e4 = local_334;
        local_f0 = BIT_lookBitsFast(local_320,local_334);
        *local_d0 = (short)local_e0[local_f0];
        local_c0 = local_d8;
        local_c4 = (uint)*(byte *)((long)local_e0 + local_f0 * 4 + 2);
        local_d8->bitsConsumed = local_c4 + local_d8->bitsConsumed;
        local_318 = (undefined2 *)
                    ((long)local_318 + (ulong)*(byte *)((long)local_e0 + local_f0 * 4 + 3));
        uVar1 = MEM_64bits();
        if (uVar1 != 0) {
          local_140 = local_318;
          local_148 = local_320;
          local_150 = local_330;
          local_154 = local_334;
          local_160 = BIT_lookBitsFast(local_320,local_334);
          *local_140 = (short)local_150[local_160];
          local_130 = local_148;
          local_134 = (uint)*(byte *)((long)local_150 + local_160 * 4 + 2);
          local_148->bitsConsumed = local_134 + local_148->bitsConsumed;
          local_318 = (undefined2 *)
                      ((long)local_318 + (ulong)*(byte *)((long)local_150 + local_160 * 4 + 3));
        }
        local_108 = local_318;
        local_110 = local_320;
        local_118 = local_330;
        local_11c = local_334;
        local_128 = BIT_lookBitsFast(local_320,local_334);
        *local_108 = (short)local_118[local_128];
        local_f8 = local_110;
        local_fc = (uint)*(byte *)((long)local_118 + local_128 * 4 + 2);
        local_110->bitsConsumed = local_fc + local_110->bitsConsumed;
        local_318 = (undefined2 *)
                    ((long)local_318 + (ulong)*(byte *)((long)local_118 + local_128 * 4 + 3));
      }
    }
    if (1 < (ulong)((long)local_328 - (long)local_318)) {
      while( true ) {
        local_308 = local_320;
        if (local_320->bitsConsumed < 0x41) {
          if (local_320->ptr < local_320->limitPtr) {
            if (local_320->ptr == local_320->start) {
              if (local_320->bitsConsumed < 0x40) {
                local_2fc = BIT_DStream_endOfBuffer;
              }
              else {
                local_2fc = BIT_DStream_completed;
              }
            }
            else {
              local_30c = local_320->bitsConsumed >> 3;
              bVar7 = local_320->ptr + -(ulong)local_30c < local_320->start;
              if (bVar7) {
                local_30c = (int)local_320->ptr - (int)local_320->start;
              }
              local_310 = (BIT_DStream_status)bVar7;
              local_320->ptr = local_320->ptr + -(ulong)local_30c;
              local_308->bitsConsumed = local_308->bitsConsumed + local_30c * -8;
              sVar5 = MEM_readLEST(in_stack_fffffffffffffc08);
              local_308->bitContainer = sVar5;
              local_2fc = local_310;
            }
          }
          else {
            local_2fc = BIT_reloadDStreamFast(in_stack_fffffffffffffc08);
          }
        }
        else {
          local_2fc = BIT_DStream_overflow;
        }
        if (local_2fc != BIT_DStream_unfinished || local_328 + -1 < local_318) break;
        local_98 = local_318;
        local_a0 = local_320;
        local_a8 = local_330;
        local_ac = local_334;
        local_b8 = BIT_lookBitsFast(local_320,local_334);
        *local_98 = (short)local_a8[local_b8];
        local_88 = local_a0;
        local_8c = (uint)*(byte *)((long)local_a8 + local_b8 * 4 + 2);
        local_a0->bitsConsumed = local_8c + local_a0->bitsConsumed;
        local_318 = (undefined2 *)
                    ((long)local_318 + (ulong)*(byte *)((long)local_a8 + local_b8 * 4 + 3));
      }
      for (; local_318 <= local_328 + -1;
          local_318 = (undefined2 *)
                      ((long)local_318 + (ulong)*(byte *)((long)local_70 + local_80 * 4 + 3))) {
        local_60 = local_318;
        local_68 = local_320;
        local_70 = local_330;
        local_74 = local_334;
        local_80 = BIT_lookBitsFast(local_320,local_334);
        *local_60 = (short)local_70[local_80];
        local_50 = local_68;
        local_54 = (uint)*(byte *)((long)local_70 + local_80 * 4 + 2);
        local_68->bitsConsumed = local_54 + local_68->bitsConsumed;
      }
    }
    if (local_318 < local_328) {
      local_28 = local_318;
      local_30 = local_320;
      local_38 = local_330;
      local_3c = local_334;
      local_48 = BIT_lookBitsFast(local_320,local_334);
      *(char *)local_28 = (char)local_38[local_48];
      if (*(char *)((long)local_38 + local_48 * 4 + 3) == '\x01') {
        local_8 = local_30;
        local_c = (uint)*(byte *)((long)local_38 + local_48 * 4 + 2);
        local_30->bitsConsumed = local_c + local_30->bitsConsumed;
      }
      else if (local_30->bitsConsumed < 0x40) {
        local_18 = local_30;
        local_1c = (uint)*(byte *)((long)local_38 + local_48 * 4 + 2);
        local_30->bitsConsumed = local_1c + local_30->bitsConsumed;
        if (0x40 < local_30->bitsConsumed) {
          local_30->bitsConsumed = 0x40;
        }
      }
      local_318 = (undefined2 *)((long)local_318 + 1);
    }
    uVar1 = BIT_endOfDStream(&local_398);
    if (uVar1 == 0) {
      local_348 = (BIT_DStream_t *)0xffffffffffffffec;
    }
    else {
      local_348 = local_358;
    }
  }
  return (size_t)local_348;
}

Assistant:

HUF_DGEN(HUF_decompress1X2_usingDTable_internal)

size_t HUF_decompress1X2_DCtx_wksp(HUF_DTable* DCtx, void* dst, size_t dstSize,
                                   const void* cSrc, size_t cSrcSize,
                                   void* workSpace, size_t wkspSize, int flags)
{
    const BYTE* ip = (const BYTE*) cSrc;

    size_t const hSize = HUF_readDTableX2_wksp(DCtx, cSrc, cSrcSize,
                                               workSpace, wkspSize, flags);
    if (HUF_isError(hSize)) return hSize;
    if (hSize >= cSrcSize) return ERROR(srcSize_wrong);
    ip += hSize; cSrcSize -= hSize;

    return HUF_decompress1X2_usingDTable_internal(dst, dstSize, ip, cSrcSize, DCtx, flags);
}